

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalRedundancyEliminationPass::EliminateRedundanciesInBB
          (LocalRedundancyEliminationPass *this,BasicBlock *block,ValueNumberTable *vnTable,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *value_to_ids)

{
  function<void_(spvtools::opt::Instruction_*)> local_70;
  undefined1 local_50 [8];
  anon_class_32_4_588186b4 func;
  bool modified;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *value_to_ids_local;
  ValueNumberTable *vnTable_local;
  BasicBlock *block_local;
  LocalRedundancyEliminationPass *this_local;
  
  func.value_to_ids._7_1_ = 0;
  func.vnTable = (ValueNumberTable *)((long)&func.value_to_ids + 7);
  local_50 = (undefined1  [8])this;
  func.this = (LocalRedundancyEliminationPass *)vnTable;
  func.modified = (bool *)value_to_ids;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LocalRedundancyEliminationPass::EliminateRedundanciesInBB(spvtools::opt::BasicBlock*,spvtools::opt::ValueNumberTable_const&,std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>*)::__0&,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_70,
             (anon_class_32_4_588186b4 *)local_50);
  BasicBlock::ForEachInst(block,&local_70,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_70);
  return (bool)(func.value_to_ids._7_1_ & 1);
}

Assistant:

bool LocalRedundancyEliminationPass::EliminateRedundanciesInBB(
    BasicBlock* block, const ValueNumberTable& vnTable,
    std::map<uint32_t, uint32_t>* value_to_ids) {
  bool modified = false;

  auto func = [this, &vnTable, &modified, value_to_ids](Instruction* inst) {
    if (inst->result_id() == 0) {
      return;
    }

    uint32_t value = vnTable.GetValueNumber(inst);

    if (value == 0) {
      return;
    }

    auto candidate = value_to_ids->insert({value, inst->result_id()});
    if (!candidate.second) {
      context()->KillNamesAndDecorates(inst);
      context()->ReplaceAllUsesWith(inst->result_id(), candidate.first->second);
      context()->KillInst(inst);
      modified = true;
    }
  };
  block->ForEachInst(func);
  return modified;
}